

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::FindFieldEntryTest_EmptyMessage_Test::TestBody
          (FindFieldEntryTest_EmptyMessage_Test *this)

{
  EqMatcher<std::nullptr_t> matcher;
  bool bVar1;
  const_iterator piVar2;
  char *pcVar3;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe44;
  FastFieldEntry *local_140;
  AssertHelper local_138;
  Message local_130;
  string_view local_128;
  ComparisonBase<testing::internal::EqMatcher<const_char_*>,_const_char_*,_std::equal_to<void>_>
  local_118;
  EqMatcher<const_char_*> local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  Message local_f0 [3];
  FieldEntry *local_d8;
  testing local_d0 [8];
  char local_c8 [8];
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  int i;
  const_iterator __end2;
  const_iterator __begin2;
  undefined4 local_90;
  undefined4 local_8c;
  initializer_list<int> local_88;
  initializer_list<int> *local_78;
  initializer_list<int> *__range2;
  TableType table;
  FindFieldEntryTest_EmptyMessage_Test *this_local;
  
  uVar4 = 0x4c;
  table.field_names._M_elems._12_8_ = this;
  TcParseTableBase::TcParseTableBase
            ((TcParseTableBase *)&__range2,0,0,0,'\0',0x48,0xffffffff,0x4c,0,0,0x4c,(ClassData *)0x0
             ,(PostLoopHandler)0x0,(TailCallParseFunc)0x0);
  local_140 = (FastFieldEntry *)&table.header.fallback;
  do {
    memset(local_140,0,0x10);
    TcParseTableBase::FastFieldEntry::FastFieldEntry(local_140);
    local_140 = local_140 + 1;
  } while (local_140 != (FastFieldEntry *)&table.fast_entries._M_elems[0].bits);
  table.fast_entries._M_elems[0].bits.field_0.data._0_2_ = 0xffff;
  table.fast_entries._M_elems[0].bits.field_0.data._2_2_ = 0xffff;
  table._68_8_ = 0xb;
  builtin_strncpy(table.field_names._M_elems,"MessageName",0xc);
  __begin2._0_4_ = 0;
  __begin2._4_4_ = 4;
  local_90 = 0x70;
  local_8c = 500000000;
  local_88._M_array = (iterator)&__begin2;
  local_88._M_len = 4;
  local_78 = &local_88;
  __end2 = std::initializer_list<int>::begin(local_78);
  piVar2 = std::initializer_list<int>::end(local_78);
  for (; __end2 != piVar2; __end2 = __end2 + 1) {
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = *__end2;
    testing::Eq<decltype(nullptr)>(local_d0,(void *)0x0);
    matcher.
    super_ComparisonBase<testing::internal::EqMatcher<std::nullptr_t>,_std::nullptr_t,_std::equal_to<void>_>
    .rhs_._4_4_ = in_stack_fffffffffffffe44;
    matcher.
    super_ComparisonBase<testing::internal::EqMatcher<std::nullptr_t>,_std::nullptr_t,_std::equal_to<void>_>
    .rhs_._0_4_ = uVar4;
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<decltype(nullptr)>>(matcher);
    local_d8 = FindFieldEntryTest::FindFieldEntry<0ul,0ul,0ul,20ul,2ul>
                         ((TcParseTable<0UL,_0UL,_0UL,_20UL,_2UL> *)&__range2,
                          gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::EqMatcher<decltype(nullptr)>>::operator()
              ((AssertionResult *)local_c0,local_c8,(FieldEntry **)"FindFieldEntry(table, i)");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar1) {
      testing::Message::Message(local_f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
                 ,0x26e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  }
  local_118.rhs_ = (char *)testing::Eq<char_const*>("MessageName");
  local_110.
  super_ComparisonBase<testing::internal::EqMatcher<const_char_*>,_const_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<const_char_*>,_const_char_*,_std::equal_to<void>_>
           )testing::internal::
            MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char_const*>>
                      ((EqMatcher<const_char_*>)local_118.rhs_);
  local_128 = FindFieldEntryTest::MessageName<0ul,0ul,0ul,20ul,2ul>
                        ((TcParseTable<0UL,_0UL,_0UL,_20UL,_2UL> *)&__range2);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char_const*>>::
  operator()((AssertionResult *)local_108,(char *)&local_110,
             (basic_string_view<char,_std::char_traits<char>_> *)"MessageName(table)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x270,pcVar3);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  return;
}

Assistant:

TEST_F(FindFieldEntryTest, EmptyMessage) {
  // Ensure that tables with no fields are handled correctly.
  using TableType = TcParseTable<0, 0, 0, 20, 2>;
  // clang-format off
  TableType table = {
      // header:
      {
          0, 0,  // has_bits_offset, extensions
          0,     // max_field_number
          0,     // fast_idx_mask,
          offsetof(decltype(table), field_lookup_table),
          0xFFFFFFFF,       // no fields
          offsetof(decltype(table), field_names),  // no field_entries
          0,           // num_field_entries
          0,           // num_aux_entries
          offsetof(TableType, field_names),
          nullptr,     // default instance
          nullptr,     // post_loop_handler
          nullptr,     // fallback function
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
          nullptr,     // to_prefetch
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE
      },
      {},  // fast_entries
      {{// empty field lookup table
        65535, 65535
      }},
      {{
          "\13\0\0\0\0\0\0\0"
          "MessageName"
      }},
  };
  // clang-format on

  for (int i : {0, 4, 112, 500000000}) {
    EXPECT_THAT(FindFieldEntry(table, i), Eq(nullptr));
  }
  EXPECT_THAT(MessageName(table), Eq("MessageName"));
}